

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O0

Vector2f Rml::CalculateAutoscrollVelocity(Vector2f target_delta,float dp_ratio)

{
  float fVar1;
  Vector2f VVar2;
  Vector2<float> VVar3;
  float local_5c;
  float local_54;
  Vector2<float> local_34;
  Vector2<float> local_2c;
  Vector2<float> local_24;
  float local_1c;
  float fStack_18;
  float dp_ratio_local;
  Vector2f target_delta_local;
  
  local_1c = dp_ratio;
  _fStack_18 = target_delta;
  local_24 = Vector2<float>::operator/((Vector2<float> *)&stack0xffffffffffffffe8,dp_ratio);
  fStack_18 = local_24.x;
  fVar1 = fStack_18;
  _fStack_18 = local_24;
  fVar1 = Math::Absolute(fVar1);
  if (10.0 <= fVar1) {
    local_54 = fStack_18;
  }
  else {
    local_54 = 0.0;
  }
  fVar1 = Math::Absolute(dp_ratio_local);
  if (10.0 <= fVar1) {
    local_5c = dp_ratio_local;
  }
  else {
    local_5c = 0.0;
  }
  Vector2<float>::Vector2(&local_2c,local_54,local_5c);
  _fStack_18 = local_2c;
  local_34 = operator*(0.09,local_2c);
  VVar2 = Math::Absolute(_fStack_18);
  VVar3 = Vector2<float>::operator*(&local_34,VVar2);
  VVar2.x = VVar3.x;
  VVar2.y = VVar3.y;
  return VVar2;
}

Assistant:

static Vector2f CalculateAutoscrollVelocity(Vector2f target_delta, float dp_ratio)
{
	target_delta = target_delta / dp_ratio;
	target_delta = {
		Math::Absolute(target_delta.x) < AUTOSCROLL_DEADZONE ? 0.f : target_delta.x,
		Math::Absolute(target_delta.y) < AUTOSCROLL_DEADZONE ? 0.f : target_delta.y,
	};

	// We use a signed square model for the velocity, which seems to work quite well. This is mostly about feeling and tuning.
	return AUTOSCROLL_SPEED_FACTOR * target_delta * Math::Absolute(target_delta);
}